

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O1

int MRIStepSetDeduceImplicitRhs(void *arkode_mem,int deduce)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem local_18;
  ARKodeMem local_10;
  
  iVar1 = mriStep_AccessStepMem(arkode_mem,"MRIStepSetDeduceImplicitRhs",&local_10,&local_18);
  if (iVar1 == 0) {
    local_18->deduce_rhs = deduce;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int MRIStepSetDeduceImplicitRhs(void *arkode_mem, sunbooleantype deduce)
{
  ARKodeMem        ark_mem;
  ARKodeMRIStepMem step_mem;
  int              retval;

  /* access ARKodeMRIStepMem structure and set function pointer */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepSetDeduceImplicitRhs",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  step_mem->deduce_rhs = deduce;
  return(ARK_SUCCESS);
}